

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::WriteToMultipleSSBOCase::iterate
          (WriteToMultipleSSBOCase *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *this_00;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLenum GVar6;
  char *__s;
  size_t sVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar9;
  undefined4 extraout_var_01;
  ulong uVar10;
  TestError *pTVar11;
  long *plVar12;
  size_type *psVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  deUint32 ref;
  deUint32 res;
  BufferMemMap bufMap;
  InterfaceVariableInfo value0Info;
  Buffer outputBuffer1;
  Buffer outputBuffer0;
  InterfaceVariableInfo value1Info;
  ShaderProgram program;
  ostringstream src;
  undefined1 auStack_5f8 [12];
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  BufferMemMap local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  InterfaceVariableInfo local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  ObjectWrapper local_478;
  ObjectWrapper local_460;
  InterfaceVariableInfo local_448;
  ShaderProgram local_3f8;
  undefined1 local_328 [120];
  ios_base local_2b0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_298;
  undefined1 local_278 [208];
  long local_1a8 [14];
  ios_base local_138 [264];
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration(version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_5f8 + *(long *)(local_1a8[0] + -0x18)) + 0x450);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", local_size_y = ",0x11);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", local_size_z = ",0x11);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(binding = 0) buffer Out0 {\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    uint values[",0x10);
  if (this->m_isSized == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    std::ostream::operator<<(local_328,this->m_numValues);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base((ios_base *)(local_328 + 0x70));
  }
  else {
    local_3f8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)&local_3f8.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,0x98644f);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_3f8.m_shaders[0].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3f8.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} sb_out0;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(binding = 1) buffer Out1 {\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    uint values[",0x10);
  if (this->m_isSized == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    std::ostream::operator<<(local_328,this->m_numValues);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base((ios_base *)(local_328 + 0x70));
  }
  else {
    local_588.name._M_dataplus._M_p = (pointer)&local_588.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,0x98644f);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_588.name._M_dataplus._M_p,local_588.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} sb_out1;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
             ,0x78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        uint offset          = numValuesPerInv*groupNdx;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"            sb_out0.values[offset + ndx] = offset + ndx;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        uint offset          = numValuesPerInv*groupNdx;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588.name._M_dataplus._M_p != &local_588.name.field_2) {
    operator_delete(local_588.name._M_dataplus._M_p,
                    CONCAT71(local_588.name.field_2._M_allocated_capacity._1_7_,
                             local_588.name.field_2._M_local_buf[0]) + 1);
  }
  if (local_3f8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_3f8.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_3f8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_278[0x10] = 0;
  local_278._17_8_ = 0;
  local_278._0_8_ = (pointer)0x0;
  local_278[8] = 0;
  local_278._9_7_ = 0;
  memset(local_328,0,0xac);
  std::__cxx11::stringbuf::str();
  psVar13 = &local_588.name._M_string_length;
  local_588.name._M_dataplus._M_p._0_4_ = 5;
  puVar1 = (undefined1 *)((long)&local_588.name.field_2 + 8);
  local_588.name._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar13,local_448.name._M_dataplus._M_p,
             local_448.name._M_dataplus._M_p + local_448.name._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + ((ulong)local_588.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)psVar13);
  glu::ShaderProgram::ShaderProgram(&local_3f8,renderCtx,(ProgramSources *)local_328);
  if ((undefined1 *)local_588.name._M_string_length != puVar1) {
    operator_delete((void *)local_588.name._M_string_length,local_588.name.field_2._8_8_ + 1);
  }
  paVar2 = &local_448.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_448.name._M_dataplus._M_p,
                    CONCAT71(local_448.name.field_2._M_allocated_capacity._1_7_,
                             local_448.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_298);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_3f8
                 );
  if (local_3f8.m_program.m_info.linkOk != false) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper
              (&local_460,(Functions *)CONCAT44(extraout_var_00,iVar3),pOVar9);
    GVar4 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e5,"Out0.values");
    local_588.name._M_dataplus._M_p = (pointer)&local_588.name.field_2;
    local_588.name._M_string_length = 0;
    local_588.name.field_2._M_local_buf[0] = '\0';
    local_588.index = 0xffffffff;
    local_588.blockIndex = 0xffffffff;
    local_588.atomicCounterBufferIndex = 0xffffffff;
    local_588.type = 0;
    local_588.arraySize = 0;
    local_588.offset = 0;
    local_588.arrayStride = 0;
    local_588._60_5_ = 0;
    local_588._65_8_ = 0;
    glu::getProgramInterfaceVariableInfo(gl,local_3f8.m_program.m_program,0x92e5,GVar4,&local_588);
    uVar16 = this->m_numValues * local_588.arrayStride;
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper
              (&local_478,(Functions *)CONCAT44(extraout_var_01,iVar3),pOVar9);
    GVar4 = (*gl->getProgramResourceIndex)(local_3f8.m_program.m_program,0x92e5,"Out1.values");
    local_448.name._M_string_length = 0;
    local_448.name.field_2._M_local_buf[0] = '\0';
    local_448.index = 0xffffffff;
    local_448.blockIndex = 0xffffffff;
    local_448.atomicCounterBufferIndex = 0xffffffff;
    local_448.type = 0;
    local_448.arraySize = 0;
    local_448.offset = 0;
    local_448.arrayStride = 0;
    local_448._60_5_ = 0;
    local_448._65_8_ = 0;
    local_448.name._M_dataplus._M_p = (pointer)paVar2;
    glu::getProgramInterfaceVariableInfo(gl,local_3f8.m_program.m_program,0x92e5,GVar4,&local_448);
    dVar5 = 0;
    if (this->m_isSized != false) {
      dVar5 = this->m_numValues;
    }
    if (local_588.arraySize == dVar5) {
      if (local_448.arraySize == dVar5) {
        uVar14 = this->m_numValues * local_448.arrayStride;
        local_328._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_328 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Work groups: ",0xd);
        tcu::operator<<((ostream *)this_00,&this->m_workSize);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_2b0);
        (*gl->useProgram)(local_3f8.m_program.m_program);
        (*gl->bindBuffer)(0x90d2,local_460.m_object);
        (*gl->bufferData)(0x90d2,(ulong)uVar16,(void *)0x0,0x88e0);
        (*gl->bindBufferBase)(0x90d2,0,local_460.m_object);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"Buffer setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                        ,0x21f);
        (*gl->bindBuffer)(0x90d2,local_478.m_object);
        (*gl->bufferData)(0x90d2,(ulong)uVar14,(void *)0x0,0x88e0);
        (*gl->bindBufferBase)(0x90d2,1,local_478.m_object);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"Buffer setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                        ,0x226);
        (*gl->dispatchCompute)
                  ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],
                   (this->m_workSize).m_data[2]);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glDispatchCompute()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                        ,0x22b);
        (*gl->bindBuffer)(0x90d2,local_460.m_object);
        BufferMemMap::BufferMemMap(&local_5c0,gl,0x90d2,0,uVar16,1);
        local_5ec = 0;
        if ((ulong)(uint)this->m_numValues != 0) {
          uVar10 = 0;
          uVar15 = 0;
          do {
            local_5e4 = *(uint *)((long)local_5c0.m_ptr + uVar10 + local_588.offset);
            local_5e8 = (uint)uVar15;
            if (uVar15 != local_5e4) {
              pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_538,"Comparison failed for Out0.values[","");
              de::toString<unsigned_int>(&local_4d8,&local_5ec);
              std::operator+(&local_4b8,&local_538,&local_4d8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_4b8);
              local_5a8._M_dataplus._M_p = (pointer)*plVar12;
              psVar13 = (size_type *)(plVar12 + 2);
              if ((size_type *)local_5a8._M_dataplus._M_p == psVar13) {
                local_5a8.field_2._M_allocated_capacity = *psVar13;
                local_5a8.field_2._8_8_ = plVar12[3];
                local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
              }
              else {
                local_5a8.field_2._M_allocated_capacity = *psVar13;
              }
              local_5a8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              de::toString<unsigned_int>(&local_4f8,&local_5e4);
              std::operator+(&local_498,&local_5a8,&local_4f8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_498);
              local_5e0._M_dataplus._M_p = (pointer)*plVar12;
              psVar13 = (size_type *)(plVar12 + 2);
              if ((size_type *)local_5e0._M_dataplus._M_p == psVar13) {
                local_5e0.field_2._M_allocated_capacity = *psVar13;
                local_5e0.field_2._8_8_ = plVar12[3];
                local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
              }
              else {
                local_5e0.field_2._M_allocated_capacity = *psVar13;
              }
              local_5e0._M_string_length = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              de::toString<unsigned_int>(&local_518,&local_5e8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_328,&local_5e0,&local_518);
              tcu::TestError::TestError(pTVar11,(string *)local_328);
              __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            uVar15 = uVar15 + 1;
            local_5ec = (uint)uVar15;
            uVar10 = (ulong)(uint)((int)uVar10 + local_588.arrayStride);
          } while ((uint)this->m_numValues != uVar15);
        }
        (*(local_5c0.m_gl)->unmapBuffer)(local_5c0.m_target);
        (*gl->bindBuffer)(0x90d2,local_478.m_object);
        BufferMemMap::BufferMemMap(&local_5c0,gl,0x90d2,0,uVar14,1);
        uVar10 = (ulong)(uint)this->m_numValues;
        local_5ec = 0;
        if (uVar10 != 0) {
          uVar15 = 0;
          uVar16 = 1;
          do {
            uVar14 = uVar16;
            local_5e4 = *(uint *)((long)local_5c0.m_ptr + uVar15 + local_448.offset);
            local_5e8 = (uint)uVar10;
            if (local_5e8 != local_5e4) {
              pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_538,"Comparison failed for Out1.values[","");
              de::toString<unsigned_int>(&local_4d8,&local_5ec);
              std::operator+(&local_4b8,&local_538,&local_4d8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_4b8);
              local_5a8._M_dataplus._M_p = (pointer)*plVar12;
              psVar13 = (size_type *)(plVar12 + 2);
              if ((size_type *)local_5a8._M_dataplus._M_p == psVar13) {
                local_5a8.field_2._M_allocated_capacity = *psVar13;
                local_5a8.field_2._8_8_ = plVar12[3];
                local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
              }
              else {
                local_5a8.field_2._M_allocated_capacity = *psVar13;
              }
              local_5a8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              de::toString<unsigned_int>(&local_4f8,&local_5e4);
              std::operator+(&local_498,&local_5a8,&local_4f8);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_498);
              local_5e0._M_dataplus._M_p = (pointer)*plVar12;
              psVar13 = (size_type *)(plVar12 + 2);
              if ((size_type *)local_5e0._M_dataplus._M_p == psVar13) {
                local_5e0.field_2._M_allocated_capacity = *psVar13;
                local_5e0.field_2._8_8_ = plVar12[3];
                local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
              }
              else {
                local_5e0.field_2._M_allocated_capacity = *psVar13;
              }
              local_5e0._M_string_length = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              de::toString<unsigned_int>(&local_518,&local_5e8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_328,&local_5e0,&local_518);
              tcu::TestError::TestError(pTVar11,(string *)local_328);
              __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            uVar15 = (ulong)(uint)((int)uVar15 + local_448.arrayStride);
            uVar10 = uVar10 - 1;
            uVar16 = uVar14 + 1;
            local_5ec = uVar14;
          } while (uVar10 != 0);
        }
        (*(local_5c0.m_gl)->unmapBuffer)(local_5c0.m_target);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448.name._M_dataplus._M_p != paVar2) {
          operator_delete(local_448.name._M_dataplus._M_p,
                          CONCAT71(local_448.name.field_2._M_allocated_capacity._1_7_,
                                   local_448.name.field_2._M_local_buf[0]) + 1);
        }
        glu::ObjectWrapper::~ObjectWrapper(&local_478);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588.name._M_dataplus._M_p != &local_588.name.field_2) {
          operator_delete(local_588.name._M_dataplus._M_p,
                          CONCAT71(local_588.name.field_2._M_allocated_capacity._1_7_,
                                   local_588.name.field_2._M_local_buf[0]) + 1);
        }
        glu::ObjectWrapper::~ObjectWrapper(&local_460);
        glu::ShaderProgram::~ShaderProgram(&local_3f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return STOP;
      }
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,(char *)0x0,
                 "value1Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x213);
    }
    else {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,(char *)0x0,
                 "value0Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x212);
    }
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x206);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Out0 {\n"
			<< "    uint values[" << (m_isSized ? de::toString(m_numValues) : string("")) << "];\n"
			<< "} sb_out0;\n"
			<< "layout(binding = 1) buffer Out1 {\n"
			<< "    uint values[" << (m_isSized ? de::toString(m_numValues) : string("")) << "];\n"
			<< "} sb_out1;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "\n"
			<< "    {\n"
			<< "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
			<< "        uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "            sb_out0.values[offset + ndx] = offset + ndx;\n"
			<< "    }\n"
			<< "    {\n"
			<< "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
			<< "        uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
			<< "    }\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const Buffer				outputBuffer0	(m_context.getRenderContext());
		const deUint32				value0Index		= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Out0.values");
		const InterfaceVariableInfo	value0Info		= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, value0Index);
		const deUint32				block0Size		= value0Info.arrayStride*(deUint32)m_numValues;

		const Buffer				outputBuffer1	(m_context.getRenderContext());
		const deUint32				value1Index		= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Out1.values");
		const InterfaceVariableInfo	value1Info		= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, value1Index);
		const deUint32				block1Size		= value1Info.arrayStride*(deUint32)m_numValues;

		TCU_CHECK(value0Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0));
		TCU_CHECK(value1Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0));

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer0);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, block0Size, DE_NULL, GL_STREAM_DRAW);

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");
		}
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer1);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, block1Size, DE_NULL, GL_STREAM_DRAW);

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer0);
		{
			const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, block0Size, GL_MAP_READ_BIT);

			for (deUint32 ndx = 0; ndx < (deUint32)m_numValues; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + value0Info.offset + value0Info.arrayStride*ndx));
				const deUint32	ref		= ndx;

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Out0.values[") + de::toString(ndx) + "] res=" + de::toString(res) + " ref=" + de::toString(ref));
			}
		}
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer1);
		{
			const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, block1Size, GL_MAP_READ_BIT);

			for (deUint32 ndx = 0; ndx < (deUint32)m_numValues; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + value1Info.offset + value1Info.arrayStride*ndx));
				const deUint32	ref		= m_numValues - ndx;

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Out1.values[") + de::toString(ndx) + "] res=" + de::toString(res) + " ref=" + de::toString(ref));
			}
		}
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}